

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthVarInSupport(uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x113,"int Kit_TruthVarInSupport(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pTruth[Step] & 0x55555555) != (pTruth[Step] & 0xaaaaaaaa) >> 1) {
        return 1;
      }
    }
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pTruth[Step] & 0x33333333) != (pTruth[Step] & 0xcccccccc) >> 2) {
        return 1;
      }
    }
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pTruth[Step] & 0xf0f0f0f) != (pTruth[Step] & 0xf0f0f0f0) >> 4) {
        return 1;
      }
    }
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pTruth[Step] & 0xff00ff) != (pTruth[Step] & 0xff00ff00) >> 8) {
        return 1;
      }
    }
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      if ((pTruth[Step] & 0xffff) != pTruth[Step] >> 0x10) {
        return 1;
      }
    }
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pTruth;
    for (local_2c = 0; local_2c < iVar1; local_2c = iVar2 * 2 + local_2c) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        if (_iVar_local[Step] != _iVar_local[iVar2 + Step]) {
          return 1;
        }
      }
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return 0;
}

Assistant:

int Kit_TruthVarInSupport( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x55555555) != ((pTruth[i] & 0xAAAAAAAA) >> 1) )
                return 1;
        return 0;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x33333333) != ((pTruth[i] & 0xCCCCCCCC) >> 2) )
                return 1;
        return 0;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0F0F0F0F) != ((pTruth[i] & 0xF0F0F0F0) >> 4) )
                return 1;
        return 0;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x00FF00FF) != ((pTruth[i] & 0xFF00FF00) >> 8) )
                return 1;
        return 0;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0000FFFF) != ((pTruth[i] & 0xFFFF0000) >> 16) )
                return 1;
        return 0;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( pTruth[i] != pTruth[Step+i] )
                    return 1;
            pTruth += 2*Step;
        }
        return 0;
    }
}